

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flasher.cpp
# Opt level: O3

ssize_t __thiscall Flasher::read(Flasher *this,int __fd,void *__buf,size_t __nbytes)

{
  _func_int *p_Var1;
  FlasherObserver *pFVar2;
  Flash *pFVar3;
  ulong uVar4;
  long lVar5;
  FILE *pFVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  size_t sVar11;
  undefined4 extraout_var;
  undefined8 *puVar12;
  int *piVar13;
  Flasher *pFVar14;
  undefined4 in_register_00000034;
  pointer_____offset_0x10___ *ppuVar15;
  uint uVar16;
  ulong uVar17;
  undefined8 uStack_60;
  Flasher *local_58;
  ulong local_50;
  ulong local_48;
  FILE *local_40;
  uint local_34;
  
  local_40 = (FILE *)CONCAT44(in_register_00000034,__fd);
  uVar17 = (ulong)__buf & 0xffffffff;
  uStack_60 = 0x10aea3;
  uVar7 = (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
             super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
             super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[3])();
  lVar5 = -((ulong)uVar7 + 0xf & 0xfffffffffffffff0);
  local_48 = (__nbytes & 0xffffffff) / (ulong)uVar7;
  if ((int)((__nbytes & 0xffffffff) % (ulong)uVar7) == 0) {
    p_Var1 = ((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
              super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
              super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[6];
    *(undefined8 *)((long)&uStack_60 + lVar5) = 0x10aeda;
    uVar8 = (*p_Var1)();
    if ((uint)__nbytes < uVar8) {
      if ((int)__buf == 0) {
        p_Var1 = ((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>.
                  _M_t.super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                  super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[4];
        *(undefined8 *)((long)&uStack_60 + lVar5) = 0x10aef5;
        iVar9 = (*p_Var1)();
        uVar17 = (ulong)((iVar9 - (int)local_48) * uVar7);
      }
      uVar16 = ((int)uVar17 + uVar7) - 1;
      uVar4 = (ulong)uVar16 / (ulong)uVar7;
      iVar9 = (int)local_48;
      uVar8 = (uint)uVar4;
      p_Var1 = ((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
                super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[4];
      local_58 = this;
      local_50 = uVar17;
      *(undefined8 *)((long)&uStack_60 + lVar5) = 0x10af31;
      uVar10 = (*p_Var1)();
      pFVar6 = local_40;
      if (iVar9 + uVar8 <= uVar10) {
        local_34 = uVar16;
        *(undefined8 *)((long)&uStack_60 + lVar5) = 0x10af4d;
        local_40 = fopen((char *)pFVar6,"wb");
        uVar17 = local_50;
        pFVar14 = local_58;
        if (local_40 == (FILE *)0x0) {
          *(undefined8 *)((long)&uStack_60 + lVar5) = 0x10b095;
          puVar12 = (undefined8 *)__cxa_allocate_exception(0x10);
          *(undefined8 *)((long)&uStack_60 + lVar5) = 0x10b09d;
          piVar13 = __errno_location();
          iVar9 = *piVar13;
          *puVar12 = &PTR__exception_001183b0;
          *(int *)(puVar12 + 1) = iVar9;
          *(undefined1 **)((long)&uStack_60 + lVar5) = &LAB_0010b0c2;
          __cxa_throw(puVar12,&FileOpenError::typeinfo,std::exception::~exception);
        }
        pFVar2 = local_58->_observer;
        uVar10 = 0;
        p_Var1 = pFVar2->_vptr_FlasherObserver[2];
        *(undefined8 *)((long)&uStack_60 + lVar5) = 0x10af78;
        (*p_Var1)(pFVar2,"Read %d bytes from flash\n",uVar17);
        if (uVar7 <= local_34) {
          local_34 = uVar8 - 1;
          do {
            pFVar2 = pFVar14->_observer;
            p_Var1 = pFVar2->_vptr_FlasherObserver[3];
            *(undefined8 *)((long)&uStack_60 + lVar5) = 0x10af95;
            (*p_Var1)(pFVar2,(ulong)uVar10,uVar4);
            pFVar3 = (pFVar14->_flash->_M_t).
                     super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
                     super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                     super__Head_base<0UL,_Flash_*,_false>._M_head_impl;
            iVar9 = (int)local_48;
            p_Var1 = pFVar3->_vptr_Flash[0x19];
            *(undefined8 *)((long)&uStack_60 + lVar5) = 0x10afb0;
            (*p_Var1)(pFVar3,(ulong)(uVar10 + iVar9),(void *)((long)&local_58 + lVar5));
            pFVar6 = local_40;
            if (local_34 == uVar10) {
              uVar16 = (uint)((local_50 & 0xffffffff) % (ulong)uVar7);
              if (uVar16 != 0) {
                uVar7 = uVar16;
              }
            }
            *(undefined8 *)((long)&uStack_60 + lVar5) = 0x10afdc;
            sVar11 = fwrite((void *)((long)&local_58 + lVar5),1,(ulong)uVar7,pFVar6);
            if (sVar11 != uVar7) {
              *(undefined8 *)((long)&uStack_60 + lVar5) = 0x10b01f;
              puVar12 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar12 = &PTR__exception_00118428;
              *(undefined1 **)((long)&uStack_60 + lVar5) = &LAB_0010b03f;
              __cxa_throw(puVar12,&FileShortError::typeinfo,std::exception::~exception);
            }
            uVar10 = uVar10 + 1;
            pFVar14 = local_58;
          } while (uVar10 < uVar8);
        }
        pFVar2 = pFVar14->_observer;
        p_Var1 = pFVar2->_vptr_FlasherObserver[3];
        *(undefined8 *)((long)&uStack_60 + lVar5) = 0x10affd;
        (*p_Var1)(pFVar2,uVar4,uVar4);
        pFVar6 = local_40;
        *(undefined8 *)((long)&uStack_60 + lVar5) = 0x10b006;
        iVar9 = fclose(pFVar6);
        return CONCAT44(extraout_var,iVar9);
      }
      *(undefined8 *)((long)&uStack_60 + lVar5) = 0x10b06b;
      puVar12 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar12 = &PTR__exception_00118400;
      ppuVar15 = &FileSizeError::typeinfo;
      goto LAB_0010b07c;
    }
  }
  *(undefined8 *)((long)&uStack_60 + lVar5) = 0x10b04e;
  puVar12 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar12 = &PTR__exception_00118388;
  ppuVar15 = &FlashOffsetError::typeinfo;
LAB_0010b07c:
  *(undefined8 *)((long)&uStack_60 + lVar5) = 0x10b08b;
  __cxa_throw(puVar12,ppuVar15,std::exception::~exception);
}

Assistant:

void
Flasher::read(const char* filename, uint32_t fsize, uint32_t foffset)
{
    FILE* outfile;
    uint32_t pageSize = _flash->pageSize();
    uint8_t buffer[pageSize];
    uint32_t pageNum = 0;
    uint32_t pageOffset;
    uint32_t numPages;
    size_t fbytes;

    if (foffset % pageSize != 0 || foffset >= _flash->totalSize())
        throw FlashOffsetError();
        
    pageOffset = foffset / pageSize;

    if (fsize == 0)
        fsize = pageSize * (_flash->numPages() - pageOffset);

    numPages = (fsize + pageSize - 1) / pageSize;
    if (pageOffset + numPages > _flash->numPages())
        throw FileSizeError();
    
    outfile = fopen(filename, "wb");
    if (!outfile)
        throw FileOpenError(errno);
    
    _observer.onStatus("Read %d bytes from flash\n", fsize);
    
    try
    {
        for (pageNum = 0; pageNum < numPages; pageNum++)
        {
            _observer.onProgress(pageNum, numPages);

            _flash->readPage(pageOffset + pageNum, buffer);

            if (pageNum == numPages - 1 && fsize % pageSize > 0)
                pageSize = fsize % pageSize;
            fbytes = fwrite(buffer, 1, pageSize, outfile);
            if (fbytes != pageSize)
                throw FileShortError();
        }
    }
    catch(...)
    {
        fclose(outfile);
        throw;
    }
    
    _observer.onProgress(numPages, numPages);
    
    fclose(outfile);
}